

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O1

void ncnn::lstm_dynamic_quantize
               (Mat *bottom_blob,Mat *bottom_blob_int8,Mat *bottom_blob_int8_descales,Option *opt)

{
  uint _w;
  int _w_00;
  size_t sVar1;
  void *pvVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  float *pfVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  float *ptr;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 in_XMM1 [16];
  undefined8 uVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint local_34;
  
  _w = bottom_blob->w;
  _w_00 = bottom_blob->h;
  Mat::create(bottom_blob_int8_descales,_w_00,4,1,opt->blob_allocator);
  Mat::create(bottom_blob_int8,_w,_w_00,1,opt->blob_allocator);
  if (0 < (long)_w_00) {
    local_34 = _w & 0x7ffffffc;
    lVar9 = 0;
    do {
      uVar14 = in_XMM1._8_8_;
      ptr = (float *)(bottom_blob->w * lVar9 * bottom_blob->elemsize + (long)bottom_blob->data);
      auVar10 = ZEXT816(0);
      pfVar5 = ptr;
      uVar7 = 0;
      if (3 < (int)_w) {
        iVar6 = 3;
        do {
          auVar11._0_8_ = *(ulong *)pfVar5 & 0x7fffffff7fffffff;
          auVar11._8_4_ = ABS(pfVar5[2]);
          auVar11._12_4_ = ABS(pfVar5[3]);
          uVar14 = auVar11._8_8_;
          auVar10 = maxps(auVar10,auVar11);
          pfVar5 = pfVar5 + 4;
          iVar6 = iVar6 + 4;
          uVar7 = local_34;
        } while (iVar6 < (int)_w);
      }
      auVar3._4_8_ = uVar14;
      auVar3._0_4_ = auVar10._4_4_;
      auVar12._0_8_ = auVar3._0_8_ << 0x20;
      auVar12._8_4_ = auVar10._8_4_;
      auVar12._12_4_ = auVar10._12_4_;
      auVar13._8_8_ = auVar10._8_8_;
      auVar13._0_8_ = auVar12._8_8_;
      auVar10 = maxps(auVar13,auVar10);
      if (auVar10._0_4_ <= auVar10._4_4_) {
        auVar10._4_12_ = auVar10._4_12_;
        auVar10._0_4_ = auVar10._4_4_;
      }
      if (auVar10._0_4_ <= 0.0) {
        auVar4._12_4_ = 0;
        auVar4._0_12_ = auVar10._4_12_;
        auVar10 = auVar4 << 0x20;
      }
      if ((int)uVar7 < (int)_w) {
        lVar8 = 0;
        do {
          if (auVar10._0_4_ <= ABS(pfVar5[lVar8])) {
            auVar10._0_4_ = ABS(pfVar5[lVar8]);
          }
          lVar8 = lVar8 + 1;
        } while (_w - uVar7 != (int)lVar8);
      }
      iVar6 = bottom_blob_int8->w;
      sVar1 = bottom_blob_int8->elemsize;
      pvVar2 = bottom_blob_int8->data;
      in_XMM1._4_12_ = auVar10._4_12_;
      in_XMM1._0_4_ = auVar10._0_4_ * 0.007874016;
      *(float *)((long)bottom_blob_int8_descales->data + lVar9 * 4) = in_XMM1._0_4_;
      lstm_dynamic_quantize_scale2int8
                (ptr,_w,127.0 / auVar10._0_4_,(char *)(iVar6 * lVar9 * sVar1 + (long)pvVar2));
      lVar9 = lVar9 + 1;
    } while (lVar9 != _w_00);
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize(const Mat& bottom_blob, Mat& bottom_blob_int8, Mat& bottom_blob_int8_descales, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    // dynamic quantize bottom_blob
    bottom_blob_int8_descales.create(T, (size_t)4u, 1, opt.blob_allocator);

    bottom_blob_int8.create(size, T, (size_t)1u, opt.blob_allocator);

    // fp32
    for (int t = 0; t < T; t++)
    {
        const float* ptr = bottom_blob.row(t);
        signed char* outptr = bottom_blob_int8.row<signed char>(t);

        const float absmax = lstm_dynamic_quantize_get_absmax(ptr, size);

        bottom_blob_int8_descales[t] = absmax / 127.f;

        const float scale = 127.f / absmax;
        lstm_dynamic_quantize_scale2int8(ptr, size, scale, outptr);
    }
}